

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::ReadBestBlock(WalletBatch *this,CBlockLocator *locator)

{
  long lVar1;
  bool bVar2;
  vector<uint256,_std::allocator<uint256>_> *in_RDI;
  long in_FS_OFFSET;
  CBlockLocator *in_stack_00000010;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
  *in_stack_ffffffffffffffc8;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator->
            (in_stack_ffffffffffffffc8);
  bVar2 = DatabaseBatch::Read<std::__cxx11::string,CBlockLocator>
                    ((DatabaseBatch *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)locator,
                     in_stack_00000010);
  if ((!bVar2) || (bVar2 = std::vector<uint256,_std::allocator<uint256>_>::empty(in_RDI), bVar2)) {
    std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator->
              (in_stack_ffffffffffffffc8);
    local_9 = DatabaseBatch::Read<std::__cxx11::string,CBlockLocator>
                        ((DatabaseBatch *)this,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         locator,in_stack_00000010);
  }
  else {
    local_9 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool WalletBatch::ReadBestBlock(CBlockLocator& locator)
{
    if (m_batch->Read(DBKeys::BESTBLOCK, locator) && !locator.vHave.empty()) return true;
    return m_batch->Read(DBKeys::BESTBLOCK_NOMERKLE, locator);
}